

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<TCBPoint>::emplace<TCBPoint>
          (QPodArrayOps<TCBPoint> *this,qsizetype i,TCBPoint *args)

{
  TCBPoint **ppTVar1;
  qsizetype *pqVar2;
  qreal qVar3;
  Data *pDVar4;
  long lVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  qreal qVar9;
  TCBPoint *pTVar10;
  GrowthPosition where;
  
  pDVar4 = (this->super_QArrayDataPointer<TCBPoint>).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_003f5524:
    qVar3 = args->_b;
    qVar6 = (args->_point).xp;
    qVar7 = (args->_point).yp;
    qVar8 = args->_t;
    qVar9 = args->_c;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<TCBPoint>).size != 0);
    QArrayDataPointer<TCBPoint>::detachAndGrow
              (&this->super_QArrayDataPointer<TCBPoint>,where,1,(TCBPoint **)0x0,
               (QArrayDataPointer<TCBPoint> *)0x0);
    pTVar10 = createHole(this,where,i,1);
    (pTVar10->_point).xp = qVar6;
    (pTVar10->_point).yp = qVar7;
    pTVar10->_t = qVar8;
    pTVar10->_c = qVar9;
    pTVar10->_b = qVar3;
  }
  else {
    lVar5 = (this->super_QArrayDataPointer<TCBPoint>).size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QArrayDataPointer<TCBPoint>).ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x3333333333333333)) {
      pTVar10 = (this->super_QArrayDataPointer<TCBPoint>).ptr;
      pTVar10[lVar5]._b = args->_b;
      qVar3 = (args->_point).xp;
      qVar6 = (args->_point).yp;
      qVar7 = args->_c;
      pTVar10[lVar5]._t = args->_t;
      (&pTVar10[lVar5]._t)[1] = qVar7;
      pTVar10[lVar5]._point.xp = qVar3;
      pTVar10[lVar5]._point.yp = qVar6;
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((TCBPoint *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QArrayDataPointer<TCBPoint>).ptr)) goto LAB_003f5524;
      pTVar10 = (this->super_QArrayDataPointer<TCBPoint>).ptr;
      pTVar10[-1]._b = args->_b;
      qVar3 = (args->_point).xp;
      qVar6 = (args->_point).yp;
      qVar7 = args->_c;
      pTVar10[-1]._t = args->_t;
      pTVar10[-1]._c = qVar7;
      pTVar10[-1]._point.xp = qVar3;
      pTVar10[-1]._point.yp = qVar6;
      ppTVar1 = &(this->super_QArrayDataPointer<TCBPoint>).ptr;
      *ppTVar1 = *ppTVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<TCBPoint>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }